

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O2

void RequestHandleParserEvent(AliHttpRequest *req,int type,char *buf,int len)

{
  mapped_type *pmVar1;
  string *psVar2;
  
  switch(type) {
  case 1:
    req->response_status_code_ = (uint)req->parser_->status_code;
    break;
  case 3:
    if (req->is_last_value_ == true) {
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&req->map_reponse_headers_,&req->last_response_field_);
      std::__cxx11::string::_M_assign((string *)pmVar1);
      std::__cxx11::string::assign((char *)&req->last_response_field_);
      std::__cxx11::string::assign((char *)&req->last_response_value_);
    }
    std::__cxx11::string::append((char *)&req->last_response_field_,(ulong)buf);
    req->is_last_value_ = false;
    break;
  case 4:
    req->is_last_value_ = true;
    psVar2 = &req->last_response_value_;
    goto LAB_00195173;
  case 5:
    if ((req->last_response_field_)._M_string_length != 0) {
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&req->map_reponse_headers_,&req->last_response_field_);
      std::__cxx11::string::_M_assign((string *)pmVar1);
      std::__cxx11::string::assign((char *)&req->last_response_field_);
      std::__cxx11::string::assign((char *)&req->last_response_value_);
    }
    req->is_response_header_complete = true;
    break;
  case 6:
    psVar2 = &req->resposne_body_;
LAB_00195173:
    std::__cxx11::string::append((char *)psVar2,(ulong)buf);
    return;
  case 7:
    req->is_response_complete = true;
  }
  return;
}

Assistant:

void RequestHandleParserEvent(AliHttpRequest* req, int type, char* buf, int len) {
  switch(type) {
    case PARSER_EVENT_STATUS: {
      ALI_LOG("status = %d",  req->parser_->status_code);
      req->response_status_code_ = req->parser_->status_code;
      break;
    }
    case PARSER_EVENT_FIELD: {
      if(req->is_last_value_) {
        req->map_reponse_headers_[req->last_response_field_] = req->last_response_value_;
        req->last_response_field_ = "";
        req->last_response_value_ = "";
      }
       req->last_response_field_.append(buf, len);
       req->is_last_value_ = false;
    }
     break;
    case PARSER_EVENT_VALUE: {
      req->is_last_value_ = true;
      req->last_response_value_.append(buf, len);
      break;
    }

    case PARSER_EVENT_HEADER_COMPLETE: {
      if(req->last_response_field_.size() > 0) {
        req->map_reponse_headers_[req->last_response_field_] = req->last_response_value_;
        req->last_response_field_ = "";
        req->last_response_value_ = "";
      }
      req->is_response_header_complete = true;
      break;
    }
    case PARSER_EVENT_BODY: {
      req->resposne_body_.append(buf, len);
      break;
    }

    case PARSER_EVENT_MSG_COMPLETE: {
      req->is_response_complete = true;
      break;
    }

  }
}